

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O3

int Prs_NtkAddConcat(Prs_Ntk_t *p,Vec_Int_t *vTemp)

{
  Vec_Int_t *p_00;
  uint uVar1;
  long lVar2;
  
  p_00 = &p->vConcats;
  uVar1 = (p->vConcats).nSize;
  if ((uVar1 & 1) == 0) {
    Vec_IntPush(p_00,-1);
    uVar1 = (p->vConcats).nSize;
  }
  if ((uVar1 & 1) != 0) {
    Vec_IntPush(p_00,vTemp->nSize);
    if (0 < vTemp->nSize) {
      lVar2 = 0;
      do {
        Vec_IntPush(p_00,vTemp->pArray[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < vTemp->nSize);
    }
    return uVar1;
  }
  __assert_fail("Value & 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0x105,"int Prs_NtkAddConcat(Prs_Ntk_t *, Vec_Int_t *)");
}

Assistant:

static inline int Prs_NtkAddConcat( Prs_Ntk_t * p, Vec_Int_t * vTemp )
{
    int Value;
    if ( !(Vec_IntSize(&p->vConcats) & 1) )
        Vec_IntPush(&p->vConcats, -1);
    Value = Vec_IntSize(&p->vConcats);
    assert( Value & 1 );
    Vec_IntPush( &p->vConcats, Vec_IntSize(vTemp) );
    Vec_IntAppend( &p->vConcats, vTemp );
    return Value;
}